

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void yy_destructor(yyParser *yypParser,unsigned_short yymajor,YYMINORTYPE *yypminor)

{
  Parse *pPVar1;
  Window *pWVar2;
  int iVar3;
  undefined6 in_register_00000032;
  Expr *p;
  Window *p_00;
  IdList *pList;
  sqlite3 *psVar4;
  
  iVar3 = (int)CONCAT62(in_register_00000032,yymajor);
  if (0x70 < iVar3 - 0xccU) {
    return;
  }
  pPVar1 = yypParser->pParse;
  switch(iVar3) {
  case 0xcc:
  case 0xef:
  case 0xf0:
  case 0xfc:
    if (yypminor->yy47 != (Select *)0x0) {
      clearSelect(pPVar1->db,yypminor->yy47,1);
      return;
    }
    break;
  case 0xd8:
  case 0xd9:
  case 0xf6:
  case 0xf8:
  case 0x10b:
  case 0x116:
  case 0x118:
  case 0x11b:
  case 0x122:
  case 0x127:
  case 0x137:
    p = yypminor->yy528;
    goto LAB_001539eb;
  case 0xdd:
  case 0xe7:
  case 0xe8:
  case 0xf4:
  case 0xf7:
  case 0xf9:
  case 0xfd:
  case 0xfe:
  case 0x105:
  case 0x10c:
  case 0x115:
  case 0x117:
  case 0x136:
    if (yypminor->yy322 != (ExprList *)0x0) {
      exprListDeleteNN(pPVar1->db,yypminor->yy322);
      return;
    }
    break;
  case 0xee:
  case 0xf5:
  case 0x100:
  case 0x101:
  case 0x106:
    sqlite3SrcListDelete(pPVar1->db,yypminor->yy131);
    return;
  case 0xf1:
    sqlite3WithDelete(pPVar1->db,yypminor->yy521);
    return;
  case 0xfb:
  case 0x132:
    if (yypminor->yy41 != (Window *)0x0) {
      psVar4 = pPVar1->db;
      p_00 = yypminor->yy41;
      do {
        pWVar2 = p_00->pNextWin;
        sqlite3WindowDelete(psVar4,p_00);
        p_00 = pWVar2;
      } while (pWVar2 != (Window *)0x0);
    }
    break;
  case 0x107:
  case 0x10e:
    psVar4 = pPVar1->db;
    pList = yypminor->yy254;
    goto LAB_00153a59;
  case 0x111:
  case 0x133:
  case 0x134:
  case 0x135:
  case 0x138:
    sqlite3WindowDelete(pPVar1->db,yypminor->yy41);
    return;
  case 0x11e:
  case 0x123:
    sqlite3DeleteTriggerStep(pPVar1->db,yypminor->yy33);
    return;
  case 0x120:
    psVar4 = pPVar1->db;
    pList = (yypminor->yy180).b;
LAB_00153a59:
    sqlite3IdListDelete(psVar4,pList);
    return;
  case 0x13a:
  case 0x13b:
  case 0x13c:
    p = (yypminor->yy595).pExpr;
LAB_001539eb:
    if (p != (Expr *)0x0) {
      sqlite3ExprDeleteNN(pPVar1->db,p);
      return;
    }
  }
  return;
}

Assistant:

static void yy_destructor(
  yyParser *yypParser,    /* The parser */
  YYCODETYPE yymajor,     /* Type code for object to destroy */
  YYMINORTYPE *yypminor   /* The object to be destroyed */
){
  sqlite3ParserARG_FETCH
  sqlite3ParserCTX_FETCH
  switch( yymajor ){
    /* Here is inserted the actions which take place when a
    ** terminal or non-terminal is destroyed.  This can happen
    ** when the symbol is popped from the stack during a
    ** reduce or during error processing or when a parser is
    ** being destroyed before it is finished parsing.
    **
    ** Note: during a reduce, the only symbols destroyed are those
    ** which appear on the RHS of the rule, but which are *not* used
    ** inside the C code.
    */
/********* Begin destructor definitions ***************************************/
    case 204: /* select */
    case 239: /* selectnowith */
    case 240: /* oneselect */
    case 252: /* values */
{
sqlite3SelectDelete(pParse->db, (yypminor->yy47));
}
      break;
    case 216: /* term */
    case 217: /* expr */
    case 246: /* where_opt */
    case 248: /* having_opt */
    case 267: /* where_opt_ret */
    case 278: /* case_operand */
    case 280: /* case_else */
    case 283: /* vinto */
    case 290: /* when_clause */
    case 295: /* key_opt */
    case 311: /* filter_clause */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy528));
}
      break;
    case 221: /* eidlist_opt */
    case 231: /* sortlist */
    case 232: /* eidlist */
    case 244: /* selcollist */
    case 247: /* groupby_opt */
    case 249: /* orderby_opt */
    case 253: /* nexprlist */
    case 254: /* sclp */
    case 261: /* exprlist */
    case 268: /* setlist */
    case 277: /* paren_exprlist */
    case 279: /* case_exprlist */
    case 310: /* part_opt */
{
sqlite3ExprListDelete(pParse->db, (yypminor->yy322));
}
      break;
    case 238: /* fullname */
    case 245: /* from */
    case 256: /* seltablist */
    case 257: /* stl_prefix */
    case 262: /* xfullname */
{
sqlite3SrcListDelete(pParse->db, (yypminor->yy131));
}
      break;
    case 241: /* wqlist */
{
sqlite3WithDelete(pParse->db, (yypminor->yy521));
}
      break;
    case 251: /* window_clause */
    case 306: /* windowdefn_list */
{
sqlite3WindowListDelete(pParse->db, (yypminor->yy41));
}
      break;
    case 263: /* idlist */
    case 270: /* idlist_opt */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy254));
}
      break;
    case 273: /* filter_over */
    case 307: /* windowdefn */
    case 308: /* window */
    case 309: /* frame_opt */
    case 312: /* over_clause */
{
sqlite3WindowDelete(pParse->db, (yypminor->yy41));
}
      break;
    case 286: /* trigger_cmd_list */
    case 291: /* trigger_cmd */
{
sqlite3DeleteTriggerStep(pParse->db, (yypminor->yy33));
}
      break;
    case 288: /* trigger_event */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy180).b);
}
      break;
    case 314: /* frame_bound */
    case 315: /* frame_bound_s */
    case 316: /* frame_bound_e */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy595).pExpr);
}
      break;
/********* End destructor definitions *****************************************/
    default:  break;   /* If no destructor action specified: do nothing */
  }
}